

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

shared_ptr<simple_thread_pool::ThreadHandle> __thiscall
simple_thread_pool::ThreadPoolMgr::popThread(ThreadPoolMgr *this)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<simple_thread_pool::ThreadHandle> sVar2;
  iterator entry;
  lock_guard<std::mutex> l;
  shared_ptr<simple_thread_pool::ThreadHandle> *t_handle;
  unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
  *in_stack_ffffffffffffff88;
  unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
  *in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  __position;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  local_28;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
  local_20 [4];
  
  __position._M_cur = (__node_type *)in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff90,
             (mutex_type *)in_stack_ffffffffffffff88);
  local_20[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
       ::begin(in_stack_ffffffffffffff88);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::__detail::operator==(local_20,&local_28);
  if (bVar1) {
    std::shared_ptr<simple_thread_pool::ThreadHandle>::shared_ptr
              ((shared_ptr<simple_thread_pool::ThreadHandle> *)in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
  }
  else {
    std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false,_false>
                  *)0x110b81);
    std::shared_ptr<simple_thread_pool::ThreadHandle>::shared_ptr
              ((shared_ptr<simple_thread_pool::ThreadHandle> *)in_stack_ffffffffffffff90,
               (shared_ptr<simple_thread_pool::ThreadHandle> *)in_stack_ffffffffffffff88);
    std::
    unordered_map<unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>_>
    ::erase(in_stack_ffffffffffffff90,(iterator)__position._M_cur);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x110c13);
  sVar2.super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<simple_thread_pool::ThreadHandle>)
         sVar2.super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ThreadHandle> popThread() {
        std::lock_guard<std::mutex> l(idleThreadsLock);
        auto entry = idleThreads.begin();
        if (entry == idleThreads.end()) {
            return nullptr;
        }
        std::shared_ptr<ThreadHandle> t_handle = entry->second;
        idleThreads.erase(entry);
        return t_handle;
    }